

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise::forward
          (ConvolutionDepthWise *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  int ret;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int h;
  int w;
  Mat bottom_blob_bordered;
  Mat *_bias_data;
  Mat bias_data_flattened;
  Mat weight_data_flattened;
  int _num_output;
  int _kernel_h;
  int _kernel_w;
  Mat *top_blob;
  Mat *_weight_data;
  Mat *bottom_blob;
  Option *in_stack_fffffffffffffca0;
  Mat *in_stack_fffffffffffffca8;
  Mat *in_stack_fffffffffffffcb0;
  void **ppvVar1;
  bool local_2b1;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  void *__ptr;
  int *piVar2;
  undefined4 uVar3;
  ConvolutionDepthWise *in_stack_fffffffffffffda8;
  void *local_220;
  int *local_218;
  undefined8 local_210;
  undefined4 local_208;
  long *local_200;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined4 local_1ec;
  int local_1e8;
  long local_1e0;
  undefined4 local_1d8;
  void *local_1c8;
  int *local_1c0;
  undefined8 local_1b8;
  undefined4 local_1b0;
  long *local_1a8;
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined4 local_198;
  undefined4 local_194;
  int local_190;
  long local_188;
  int local_17c;
  int local_178;
  int local_174;
  reference local_170;
  const_reference local_168;
  const_reference local_160;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_150;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_148;
  int local_134;
  void **local_130;
  void **local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  void **local_108;
  void **local_f8;
  undefined1 *local_e0;
  void **local_d8;
  void **local_d0;
  int local_b8;
  undefined4 local_b4;
  void **local_b0;
  int local_98;
  undefined4 local_94;
  void **local_90;
  int local_78;
  undefined4 local_74;
  
  local_150 = in_RDX;
  local_148 = in_RSI;
  local_160 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_168 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_148,1);
  local_170 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_150,0);
  local_174 = local_168->w;
  local_178 = local_168->h;
  local_17c = local_168->c;
  local_130 = &local_1c8;
  local_1c8 = (void *)0x0;
  local_1c0 = (int *)0x0;
  local_1b8 = 0;
  local_1b0 = 0;
  local_1a8 = (long *)0x0;
  local_1a0 = 0;
  local_19c = 0;
  local_198 = 0;
  local_194 = 0;
  local_190 = 0;
  local_188 = 0;
  flatten(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  local_d0 = &local_1c8;
  local_2b1 = local_1c8 == (void *)0x0 || local_188 * local_190 == 0;
  if (local_2b1) {
    local_134 = -100;
    local_1d8 = 1;
    goto LAB_017879d5;
  }
  local_128 = &local_220;
  local_220 = (void *)0x0;
  local_218 = (int *)0x0;
  local_210 = 0;
  local_208 = 0;
  local_200 = (long *)0x0;
  local_1f8 = 0;
  local_1f4 = 0;
  local_1f0 = 0;
  local_1ec = 0;
  local_1e8 = 0;
  local_1e0 = 0;
  if (*(int *)(in_RDI + 0x100) == 0) {
LAB_017871c3:
    local_120 = &stack0xfffffffffffffd90;
    __ptr = (void *)0x0;
    piVar2 = (int *)0x0;
    uVar3 = 0;
    make_padding(in_stack_fffffffffffffda8,(Mat *)0x0,(Mat *)0x0,0,0,
                 (Option *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    local_e0 = &stack0xfffffffffffffd90;
    local_134 = -100;
    local_1d8 = 1;
    local_118 = &stack0xfffffffffffffd90;
    if (piVar2 != (int *)0x0) {
      local_74 = 0xffffffff;
      LOCK();
      local_78 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((local_78 == 1) && (__ptr != (void *)0x0)) {
        free(__ptr);
      }
    }
  }
  else {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_148,2);
    flatten(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    local_d8 = &local_220;
    if (local_220 != (void *)0x0 && local_1e0 * local_1e8 != 0) goto LAB_017871c3;
    local_134 = -100;
    local_1d8 = 1;
  }
  local_108 = &local_220;
  local_90 = local_108;
  if (local_218 != (int *)0x0) {
    local_94 = 0xffffffff;
    LOCK();
    local_98 = *local_218;
    *local_218 = *local_218 + -1;
    UNLOCK();
    if (local_98 == 1) {
      if (local_200 == (long *)0x0) {
        if (local_220 != (void *)0x0) {
          free(local_220);
        }
      }
      else {
        (**(code **)(*local_200 + 0x18))(local_200,local_220);
      }
    }
  }
  local_220 = (void *)0x0;
  local_210 = 0;
  local_208 = 0;
  local_1f8 = 0;
  local_1f4 = 0;
  local_1f0 = 0;
  local_1ec = 0;
  local_1e8 = 0;
  local_1e0 = 0;
  local_218 = (int *)0x0;
LAB_017879d5:
  ppvVar1 = &local_1c8;
  if (local_1c0 != (int *)0x0) {
    local_b4 = 0xffffffff;
    LOCK();
    local_b8 = *local_1c0;
    *local_1c0 = *local_1c0 + -1;
    UNLOCK();
    if (local_b8 == 1) {
      local_f8 = ppvVar1;
      local_b0 = ppvVar1;
      if (local_1a8 == (long *)0x0) {
        if (local_1c8 != (void *)0x0) {
          free(local_1c8);
        }
      }
      else {
        (**(code **)(*local_1a8 + 0x18))(local_1a8,local_1c8);
      }
    }
  }
  *ppvVar1 = (void *)0x0;
  ppvVar1[2] = (void *)0x0;
  *(undefined4 *)(ppvVar1 + 3) = 0;
  *(undefined4 *)(ppvVar1 + 5) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x2c) = 0;
  *(undefined4 *)(ppvVar1 + 6) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x34) = 0;
  *(undefined4 *)(ppvVar1 + 7) = 0;
  ppvVar1[8] = (void *)0x0;
  ppvVar1[1] = (void *)0x0;
  return local_134;
}

Assistant:

int ConvolutionDepthWise::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.c;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, _kernel_w, _kernel_h, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const int h = bottom_blob_bordered.h;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (_kernel_h - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, _num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolutiondepthwise(bottom_blob_bordered, top_blob, weight_data_flattened, bias_data_flattened, _kernel_w, _kernel_h, stride_w, stride_h, dilation_w, dilation_h, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}